

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

void vkt::anon_unknown_0::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,char *checkVarName)

{
  long lVar1;
  bool bVar2;
  DataType DVar3;
  ostream *poVar4;
  size_t ndx;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  bVar2 = true;
  lVar7 = 0x18;
  for (uVar5 = 0; lVar1 = *(long *)(dstVec4Var + 0x18),
      uVar5 < (ulong)((*(long *)(dstVec4Var + 0x20) - lVar1) / 0x50); uVar5 = uVar5 + 1) {
    pcVar6 = "RES = RES && ";
    if (bVar2) {
      pcVar6 = "bool RES = ";
      bVar2 = false;
    }
    std::operator<<((ostream *)output,pcVar6);
    DVar3 = glu::getDataTypeScalarType(*(DataType *)(lVar1 + -0x10 + lVar7));
    pcVar6 = ");\n";
    if (DVar3 == TYPE_FLOAT) {
      pcVar6 = ", 0.05);\n";
    }
    poVar4 = std::operator<<((ostream *)output,"isOk(");
    poVar4 = std::operator<<(poVar4,(string *)(lVar1 + lVar7));
    poVar4 = std::operator<<(poVar4,", ref.");
    poVar4 = std::operator<<(poVar4,(string *)(lVar1 + lVar7));
    std::operator<<(poVar4,pcVar6);
    lVar7 = lVar7 + 0x50;
  }
  poVar4 = std::operator<<((ostream *)output,"dEQP_FragColor");
  pcVar6 = " = vec4(RES, RES, RES, 1.0);\n";
  if (bVar2) {
    pcVar6 = " = vec4(1.0);\n";
  }
  std::operator<<(poVar4,pcVar6);
  return;
}

Assistant:

void genCompareOp (ostringstream& output, const char* dstVec4Var, const ValueBlock& valueBlock, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (size_t ndx = 0; ndx < valueBlock.outputs.size(); ndx++)
	{
		const Value&	val		= valueBlock.outputs[ndx];

		// Check if we're only interested in one variable (then skip if not the right one).
		if (checkVarName && val.name != checkVarName)
			continue;

		// Prefix.
		if (isFirstOutput)
		{
			output << "bool RES = ";
			isFirstOutput = false;
		}
		else
			output << "RES = RES && ";

		// Generate actual comparison.
		if (getDataTypeScalarType(val.type.getBasicType()) == glu::TYPE_FLOAT)
			output << "isOk(" << val.name << ", ref." << val.name << ", 0.05);\n";
		else
			output << "isOk(" << val.name << ", ref." << val.name << ");\n";
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n";
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}